

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Put
          (RequestsCache *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  _Any_data _Stack_88;
  code *local_78;
  RequestHolder local_68;
  
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
             &_Stack_88,aHandler);
  RequestHolder::RequestHolder(&local_68,aRequest,(ResponseHandler *)&_Stack_88);
  std::
  _Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
  ::_M_emplace_equal<ot::commissioner::coap::Coap::RequestHolder_const&>
            ((_Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
              *)&this->mContainer,&local_68);
  UpdateTimer(this);
  if (local_68.mHandler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.mHandler.super__Function_base._M_manager)
              ((_Any_data *)&local_68.mHandler,(_Any_data *)&local_68.mHandler,__destroy_functor);
  }
  if (local_68.mRequest.
      super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.mRequest.
               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&_Stack_88,&_Stack_88,__destroy_functor);
  }
  return;
}

Assistant:

void Coap::RequestsCache::Put(const RequestPtr &aRequest, ResponseHandler aHandler)
{
    Put({aRequest, aHandler});
}